

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void init_supported_formats
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                *formats)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  *pmVar1;
  unique_ptr<HawkTracer::client::Converter,std::default_delete<HawkTracer::client::Converter>>
  *puVar2;
  allocator local_79;
  string local_78 [32];
  unique_ptr<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
  local_58 [3];
  allocator local_39;
  string local_38 [32];
  unique_ptr<HawkTracer::client::ChromeTraceConverter,_std::default_delete<HawkTracer::client::ChromeTraceConverter>_>
  local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  *local_10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  *formats_local;
  
  local_10 = formats;
  HawkTracer::parser::make_unique<HawkTracer::client::ChromeTraceConverter>();
  pmVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"chrome-tracing",&local_39);
  puVar2 = (unique_ptr<HawkTracer::client::Converter,std::default_delete<HawkTracer::client::Converter>>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
              ::operator[](pmVar1,(key_type *)local_38);
  std::unique_ptr<HawkTracer::client::Converter,std::default_delete<HawkTracer::client::Converter>>
  ::operator=(puVar2,&local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  unique_ptr<HawkTracer::client::ChromeTraceConverter,_std::default_delete<HawkTracer::client::ChromeTraceConverter>_>
  ::~unique_ptr(&local_18);
  HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>();
  pmVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"callgrind",&local_79);
  puVar2 = (unique_ptr<HawkTracer::client::Converter,std::default_delete<HawkTracer::client::Converter>>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
              ::operator[](pmVar1,(key_type *)local_78);
  std::unique_ptr<HawkTracer::client::Converter,std::default_delete<HawkTracer::client::Converter>>
  ::operator=(puVar2,local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::
  unique_ptr<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
  ::~unique_ptr(local_58);
  return;
}

Assistant:

void init_supported_formats(std::map<std::string, std::unique_ptr<client::Converter>>& formats)
{
    formats["chrome-tracing"] = parser::make_unique<client::ChromeTraceConverter>();
    formats["callgrind"] = parser::make_unique<client::CallgrindConverter>();
}